

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactQuantizedBvh.cpp
# Opt level: O2

int __thiscall
cbtQuantizedBvhTree::_sort_and_calc_splitting_index
          (cbtQuantizedBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes,int startIndex,int endIndex
          ,int splitAxis)

{
  GIM_BVH_DATA *pGVar1;
  cbtScalar acVar2 [4];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  int index1;
  long lVar10;
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 in_ZMM0 [64];
  undefined1 auVar15 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  cbtVector3 cVar21;
  undefined8 local_50;
  float local_48;
  undefined4 local_44;
  cbtVector3 center;
  
  local_44 = 0;
  lVar10 = (long)startIndex;
  fVar17 = 0.0;
  fVar18 = 0.0;
  fVar19 = 0.0;
  fVar20 = 0.0;
  fVar16 = 0.0;
  lVar7 = lVar10 * 0x24;
  for (lVar9 = lVar10; auVar15 = in_ZMM0._8_56_, lVar9 < endIndex; lVar9 = lVar9 + 1) {
    pGVar1 = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_data;
    cVar21 = ::operator+((cbtVector3 *)((long)(pGVar1->m_bound).m_max.m_floats + lVar7),
                         (cbtVector3 *)((long)(pGVar1->m_bound).m_min.m_floats + lVar7));
    auVar13._0_8_ = cVar21.m_floats._0_8_;
    auVar13._8_56_ = auVar15;
    auVar3._8_4_ = 0x3f000000;
    auVar3._0_8_ = 0x3f0000003f000000;
    auVar3._12_4_ = 0x3f000000;
    auVar11 = vmulps_avx512vl(auVar13._0_16_,auVar3);
    in_ZMM0 = ZEXT1664(auVar11);
    lVar7 = lVar7 + 0x24;
    fVar17 = fVar17 + auVar11._0_4_;
    fVar18 = fVar18 + auVar11._4_4_;
    fVar19 = fVar19 + auVar11._8_4_;
    fVar20 = fVar20 + auVar11._12_4_;
    fVar16 = cVar21.m_floats[2] * 0.5 + fVar16;
  }
  lVar9 = lVar10 * 0x24;
  iVar5 = endIndex - startIndex;
  fVar12 = 1.0 / (float)iVar5;
  auVar11._0_4_ = fVar12 * fVar17;
  auVar11._4_4_ = fVar12 * fVar18;
  auVar11._8_4_ = fVar12 * fVar19;
  auVar11._12_4_ = fVar12 * fVar20;
  local_50 = vmovlps_avx(auVar11);
  local_48 = fVar12 * fVar16;
  fVar16 = *(float *)((long)&local_50 + (long)splitAxis * 4);
  auVar14 = ZEXT464((uint)fVar16);
  index1 = startIndex;
  while( true ) {
    auVar15 = auVar14._8_56_;
    if (endIndex <= lVar10) break;
    pGVar1 = (primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>).m_data;
    cVar21 = ::operator+((cbtVector3 *)((long)(pGVar1->m_bound).m_max.m_floats + lVar9),
                         (cbtVector3 *)((long)(pGVar1->m_bound).m_min.m_floats + lVar9));
    auVar14._0_8_ = cVar21.m_floats._0_8_;
    auVar14._8_56_ = auVar15;
    auVar4._8_4_ = 0x3f000000;
    auVar4._0_8_ = 0x3f0000003f000000;
    auVar4._12_4_ = 0x3f000000;
    auVar11 = vmulps_avx512vl(auVar14._0_16_,auVar4);
    acVar2 = (cbtScalar  [4])vinsertps_avx(auVar11,ZEXT416((uint)(cVar21.m_floats[2] * 0.5)),0x28);
    center.m_floats[0] = acVar2[0];
    center.m_floats[1] = acVar2[1];
    center.m_floats[2] = acVar2[2];
    center.m_floats[3] = acVar2[3];
    auVar14 = ZEXT464((uint)center.m_floats[splitAxis]);
    if (fVar16 < center.m_floats[splitAxis]) {
      cbtAlignedObjectArray<GIM_BVH_DATA>::swap
                (&primitive_boxes->super_cbtAlignedObjectArray<GIM_BVH_DATA>,(int)lVar10,index1);
      index1 = index1 + 1;
    }
    lVar10 = lVar10 + 1;
    lVar9 = lVar9 + 0x24;
  }
  iVar8 = (iVar5 >> 1) + startIndex;
  iVar6 = index1;
  if (~(iVar5 / 3) + endIndex <= index1) {
    iVar6 = iVar8;
  }
  if (index1 <= iVar5 / 3 + startIndex) {
    iVar6 = iVar8;
  }
  return iVar6;
}

Assistant:

int cbtQuantizedBvhTree::_sort_and_calc_splitting_index(
	GIM_BVH_DATA_ARRAY& primitive_boxes, int startIndex,
	int endIndex, int splitAxis)
{
	int i;
	int splitIndex = startIndex;
	int numIndices = endIndex - startIndex;

	// average of centers
	cbtScalar splitValue = 0.0f;

	cbtVector3 means(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.));
	for (i = startIndex; i < endIndex; i++)
	{
		cbtVector3 center = cbtScalar(0.5) * (primitive_boxes[i].m_bound.m_max +
											primitive_boxes[i].m_bound.m_min);
		means += center;
	}
	means *= (cbtScalar(1.) / (cbtScalar)numIndices);

	splitValue = means[splitAxis];

	//sort leafNodes so all values larger then splitValue comes first, and smaller values start from 'splitIndex'.
	for (i = startIndex; i < endIndex; i++)
	{
		cbtVector3 center = cbtScalar(0.5) * (primitive_boxes[i].m_bound.m_max +
											primitive_boxes[i].m_bound.m_min);
		if (center[splitAxis] > splitValue)
		{
			//swap
			primitive_boxes.swap(i, splitIndex);
			//swapLeafNodes(i,splitIndex);
			splitIndex++;
		}
	}

	//if the splitIndex causes unbalanced trees, fix this by using the center in between startIndex and endIndex
	//otherwise the tree-building might fail due to stack-overflows in certain cases.
	//unbalanced1 is unsafe: it can cause stack overflows
	//bool unbalanced1 = ((splitIndex==startIndex) || (splitIndex == (endIndex-1)));

	//unbalanced2 should work too: always use center (perfect balanced trees)
	//bool unbalanced2 = true;

	//this should be safe too:
	int rangeBalancedIndices = numIndices / 3;
	bool unbalanced = ((splitIndex <= (startIndex + rangeBalancedIndices)) || (splitIndex >= (endIndex - 1 - rangeBalancedIndices)));

	if (unbalanced)
	{
		splitIndex = startIndex + (numIndices >> 1);
	}

	cbtAssert(!((splitIndex == startIndex) || (splitIndex == (endIndex))));

	return splitIndex;
}